

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_worker_ctor_internal
                  (JSContext *ctx,JSValue new_target,JSWorkerMessagePipe *recv_pipe,
                  JSWorkerMessagePipe *send_pipe)

{
  int iVar1;
  undefined8 *opaque;
  JSRefCountHeader *p;
  JSRefCountHeader *p_1;
  JSValue proto_val;
  JSValue v;
  
  if ((int)new_target.tag == 3) {
    proto_val = JS_GetClassProto(ctx,js_worker_class_id);
  }
  else {
    proto_val = JS_GetPropertyStr(ctx,new_target,"prototype");
    if ((int)proto_val.tag == 6) {
      return (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  v = JS_NewObjectProtoClass(ctx,proto_val,js_worker_class_id);
  if ((0xfffffff4 < (uint)proto_val.tag) &&
     (iVar1 = *proto_val.u.ptr, *(int *)proto_val.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValue(ctx,proto_val);
  }
  if (((uint)v.tag == 6) ||
     (opaque = (undefined8 *)js_mallocz(ctx,0x18), opaque == (undefined8 *)0x0)) {
    if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *v.u.ptr, *(int *)v.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValue(ctx,v);
    }
    v = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    LOCK();
    recv_pipe->ref_count = recv_pipe->ref_count + 1;
    UNLOCK();
    *opaque = recv_pipe;
    LOCK();
    send_pipe->ref_count = send_pipe->ref_count + 1;
    UNLOCK();
    opaque[1] = send_pipe;
    JS_SetOpaque(v,opaque);
  }
  return v;
}

Assistant:

static JSValue js_worker_ctor_internal(JSContext *ctx, JSValueConst new_target,
                                       JSWorkerMessagePipe *recv_pipe,
                                       JSWorkerMessagePipe *send_pipe)
{
    JSValue obj = JS_UNDEFINED, proto;
    JSWorkerData *s;
    
    /* create the object */
    if (JS_IsUndefined(new_target)) {
        proto = JS_GetClassProto(ctx, js_worker_class_id);
    } else {
        proto = JS_GetPropertyStr(ctx, new_target, "prototype");
        if (JS_IsException(proto))
            goto fail;
    }
    obj = JS_NewObjectProtoClass(ctx, proto, js_worker_class_id);
    JS_FreeValue(ctx, proto);
    if (JS_IsException(obj))
        goto fail;
    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        goto fail;
    s->recv_pipe = js_dup_message_pipe(recv_pipe);
    s->send_pipe = js_dup_message_pipe(send_pipe);

    JS_SetOpaque(obj, s);
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}